

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaIDCStoreNodeTableItem(xmlSchemaValidCtxtPtr vctxt,xmlSchemaPSVIIDCNodePtr item)

{
  uint uVar1;
  xmlSchemaPSVIIDCNodePtr *ppxVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar3 = vctxt->nbIdcNodes;
  uVar1 = vctxt->sizeIdcNodes;
  if (iVar3 < (int)uVar1) {
    ppxVar2 = vctxt->idcNodes;
LAB_001a8566:
    vctxt->nbIdcNodes = iVar3 + 1;
    ppxVar2[iVar3] = item;
    iVar3 = 0;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar5 = 0x14;
LAB_001a8538:
      ppxVar2 = (xmlSchemaPSVIIDCNodePtr *)(*xmlRealloc)(vctxt->idcNodes,(ulong)uVar5 << 3);
      if (ppxVar2 != (xmlSchemaPSVIIDCNodePtr *)0x0) {
        vctxt->idcNodes = ppxVar2;
        vctxt->sizeIdcNodes = uVar5;
        iVar3 = vctxt->nbIdcNodes;
        goto LAB_001a8566;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar4 = uVar1 + 1 >> 1;
      uVar5 = uVar4 + uVar1;
      if (1000000000 - uVar4 < uVar1) {
        uVar5 = 1000000000;
      }
      goto LAB_001a8538;
    }
    xmlSchemaVErrMemory(vctxt);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int
xmlSchemaIDCStoreNodeTableItem(xmlSchemaValidCtxtPtr vctxt,
			       xmlSchemaPSVIIDCNodePtr item)
{
    /*
    * Add to global list.
    */
    if (vctxt->sizeIdcNodes <= vctxt->nbIdcNodes) {
        xmlSchemaPSVIIDCNodePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(vctxt->sizeIdcNodes, sizeof(tmp[0]),
                                  20, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlSchemaVErrMemory(vctxt);
	    return (-1);
	}
	tmp = xmlRealloc(vctxt->idcNodes, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlSchemaVErrMemory(vctxt);
	    return (-1);
	}

        vctxt->idcNodes = tmp;
        vctxt->sizeIdcNodes = newSize;
    }

    vctxt->idcNodes[vctxt->nbIdcNodes++] = item;
    return (0);
}